

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O2

void Ndr_NtkPrintObjects(Wln_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  puts("Node IDs and their fanins:");
  for (uVar5 = 1; (long)uVar5 < (long)(pNtk->vTypes).nSize; uVar5 = uVar5 + 1) {
    iVar3 = (int)uVar5;
    printf("%5d = ",uVar5 & 0xffffffff);
    for (uVar4 = 0; (int)uVar4 < pNtk->vFanins[uVar5].nSize; uVar4 = uVar4 + 1) {
      uVar1 = Wln_ObjFanin(pNtk,iVar3,uVar4);
      if (uVar1 != 0) {
        printf("%5d ",(ulong)uVar1);
      }
    }
    for (; uVar4 < 4; uVar4 = uVar4 + 1) {
      printf("      ");
    }
    uVar4 = Vec_IntEntry(&pNtk->vNameIds,iVar3);
    printf("    Name Id %d ",(ulong)uVar4);
    iVar2 = Vec_IntEntry(&pNtk->vTypes,iVar3);
    if (iVar2 == 3) {
      iVar2 = Wln_ObjCioId(pNtk,iVar3);
      if (iVar2 < (pNtk->vCis).nSize - (pNtk->vFfs).nSize) {
        printf("  pi  ");
      }
    }
    iVar2 = Vec_IntEntry(&pNtk->vTypes,iVar3);
    if (iVar2 == 4) {
      iVar3 = Wln_ObjCioId(pNtk,iVar3);
      if (iVar3 < (pNtk->vCos).nSize - (pNtk->vFfs).nSize) {
        printf("  po  ");
      }
    }
    putchar(10);
  }
  return;
}

Assistant:

void Ndr_NtkPrintObjects( Wln_Ntk_t * pNtk )
{
    int k, iObj, iFanin;
    printf( "Node IDs and their fanins:\n" );
    Wln_NtkForEachObj( pNtk, iObj )
    {
        printf( "%5d = ", iObj );
        Wln_ObjForEachFanin( pNtk, iObj, iFanin, k )
            printf( "%5d ", iFanin );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wln_ObjNameId(pNtk, iObj) );
        if ( Wln_ObjIsPi(pNtk, iObj) )
            printf( "  pi  " );
        if ( Wln_ObjIsPo(pNtk, iObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}